

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitRefI31(PrintExpressionContents *this,RefI31 *curr)

{
  ostream *o;
  bool bVar1;
  size_t sVar2;
  char *__s;
  string_view str;
  HeapType local_20;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.type.id == 1) {
    __s = "ref.i31";
  }
  else {
    local_20 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)59>).
                           super_Expression.type);
    bVar1 = HeapType::isShared(&local_20);
    __s = "ref.i31";
    if (bVar1) {
      __s = "ref.i31_shared";
    }
  }
  o = this->o;
  sVar2 = strlen(__s);
  str._M_str = __s;
  str._M_len = sVar2;
  printMedium(o,str);
  return;
}

Assistant:

void visitRefI31(RefI31* curr) {
    bool shared =
      curr->type != Type::unreachable && curr->type.getHeapType().isShared();
    printMedium(o, shared ? "ref.i31_shared" : "ref.i31");
  }